

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O3

void __thiscall
BoxNesting::KuhnAlgorithm::KuhnAlgorithm
          (KuhnAlgorithm *this,vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *boxes)

{
  vector<short,std::allocator<short>> *this_00;
  pointer psVar1;
  pointer psVar2;
  pointer pBVar3;
  iterator __position;
  pointer pvVar4;
  _Bvector_impl *p_Var5;
  bool bVar6;
  short sVar7;
  long lVar8;
  allocator_type local_5b;
  ushort local_5a;
  undefined1 local_58 [8];
  pointer psStack_50;
  _Bit_type *local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  _Bit_pointer local_38;
  
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar7 = (short)((long)(boxes->
                        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(boxes->
                        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555;
  this->leftVerticesCount = sVar7;
  this->rightVerticesCount = sVar7;
  local_5a = 0xffff;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)local_58,(long)sVar7,
             (value_type_conflict4 *)&local_5a,&local_5b);
  psVar1 = (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = psStack_50;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_48;
  local_58 = (undefined1  [8])0x0;
  psStack_50 = (pointer)0x0;
  local_48 = (_Bit_type *)0x0;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)psVar2 - (long)psVar1);
    if (local_58 != (undefined1  [8])0x0) {
      operator_delete((void *)local_58,(long)local_48 - (long)local_58);
    }
  }
  local_5a = 0xffff;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)local_58,(long)this->rightVerticesCount,
             (value_type_conflict4 *)&local_5a,&local_5b);
  psVar1 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = psStack_50;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_48;
  local_58 = (undefined1  [8])0x0;
  psStack_50 = (pointer)0x0;
  local_48 = (_Bit_type *)0x0;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)psVar2 - (long)psVar1);
    if (local_58 != (undefined1  [8])0x0) {
      operator_delete((void *)local_58,(long)local_48 - (long)local_58);
    }
  }
  local_5a = local_5a & 0xff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_58,(long)this->leftVerticesCount,
             (bool *)&local_5a,(allocator_type *)&local_5b);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->used).super__Bvector_base<std::allocator<bool>_>);
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_38;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = local_48;
  p_Var5 = &(this->used).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset = uStack_40;
  *(undefined4 *)&(p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
       uStack_3c;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)local_58;
  *(pointer *)
   &(this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = psStack_50;
  std::
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ::resize(&this->graph,(long)this->leftVerticesCount);
  if (0 < this->leftVerticesCount) {
    lVar8 = 0;
    do {
      std::vector<short,_std::allocator<short>_>::reserve
                ((this->graph).
                 super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar8,(long)this->rightVerticesCount);
      local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffffffff0000);
      if (0 < this->rightVerticesCount) {
        sVar7 = 0;
        do {
          pBVar3 = (boxes->super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          bVar6 = Box::operator<(pBVar3 + lVar8,pBVar3 + sVar7);
          if (bVar6) {
            this_00 = (vector<short,std::allocator<short>> *)
                      ((this->graph).
                       super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar8);
            __position._M_current = *(short **)(this_00 + 8);
            if (__position._M_current == *(short **)(this_00 + 0x10)) {
              std::vector<short,std::allocator<short>>::_M_realloc_insert<short&>
                        (this_00,__position,(short *)local_58);
            }
            else {
              *__position._M_current = local_58._0_2_;
              *(short **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          sVar7 = local_58._0_2_ + 1;
          local_58._0_2_ = sVar7;
        } while (sVar7 < this->rightVerticesCount);
      }
      pvVar4 = (this->graph).
               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar4[lVar8].super__Vector_base<short,_std::allocator<short>_>._M_impl + 0x10)
          != *(pointer *)
              ((long)&pvVar4[lVar8].super__Vector_base<short,_std::allocator<short>_>._M_impl + 8))
      {
        std::__shrink_to_fit_aux<std::vector<short,_std::allocator<short>_>,_true>::_S_do_it
                  (pvVar4 + lVar8);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->leftVerticesCount);
  }
  return;
}

Assistant:

KuhnAlgorithm::KuhnAlgorithm(const std::vector<Box>& boxes)
{
	// In the boxes case left and right vertices are the same amount since
	// they are the amount of boxes
	this->leftVerticesCount = static_cast<int16_t>(boxes.size());
	this->rightVerticesCount = this->leftVerticesCount;

	this->pairsLeft = std::vector<int16_t>(this->leftVerticesCount, -1);
	this->pairsRight = std::vector<int16_t>(this->rightVerticesCount, -1);
	this->used = std::vector<bool>(this->leftVerticesCount, false);

	this->graph.resize(this->leftVerticesCount);
	for (int16_t i = 0; i < this->leftVerticesCount; ++i) {
		this->graph[i].reserve(this->rightVerticesCount);
		for (int16_t j = 0; j < this->rightVerticesCount; ++j) {
			if (boxes[i] < boxes[j]) {
				this->graph[i].emplace_back(j);
			}
		}
		this->graph[i].shrink_to_fit();
	}
}